

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afglobal.c
# Opt level: O3

void af_face_globals_free(AF_FaceGlobals globals)

{
  FT_Memory memory;
  AF_StyleMetrics_conflict P;
  long lVar1;
  
  if (globals != (AF_FaceGlobals)0x0) {
    memory = globals->face->memory;
    lVar1 = 0;
    do {
      P = *(AF_StyleMetrics_conflict *)((long)globals->metrics + lVar1);
      if (P != (AF_StyleMetrics_conflict)0x0) {
        if (af_writing_system_classes[*(uint *)(*(long *)((long)af_style_classes + lVar1) + 4)]->
            style_metrics_done != (AF_WritingSystem_DoneMetricsFunc)0x0) {
          (*af_writing_system_classes[*(uint *)(*(long *)((long)af_style_classes + lVar1) + 4)]->
            style_metrics_done)(P);
          P = *(AF_StyleMetrics_conflict *)((long)globals->metrics + lVar1);
        }
        ft_mem_free(memory,P);
        *(undefined8 *)((long)globals->metrics + lVar1) = 0;
      }
      lVar1 = lVar1 + 8;
    } while (lVar1 != 0x2b8);
    ft_mem_free(memory,globals);
    return;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  af_face_globals_free( AF_FaceGlobals  globals )
  {
    if ( globals )
    {
      FT_Memory  memory = globals->face->memory;
      FT_UInt    nn;


      for ( nn = 0; nn < AF_STYLE_MAX; nn++ )
      {
        if ( globals->metrics[nn] )
        {
          AF_StyleClass          style_class =
            af_style_classes[nn];
          AF_WritingSystemClass  writing_system_class =
            af_writing_system_classes[style_class->writing_system];


          if ( writing_system_class->style_metrics_done )
            writing_system_class->style_metrics_done( globals->metrics[nn] );

          FT_FREE( globals->metrics[nn] );
        }
      }

#ifdef FT_CONFIG_OPTION_USE_HARFBUZZ
      hb_font_destroy( globals->hb_font );
      hb_buffer_destroy( globals->hb_buf );
#endif

      /* no need to free `globals->glyph_styles'; */
      /* it is part of the `globals' array        */
      FT_FREE( globals );
    }
  }